

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams(ZSTD_compressionParameters *__return_storage_ptr__,
                  ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize)

{
  ZSTD_compressionParameters cParams;
  undefined1 auVar1 [20];
  ZSTD_compressionParameters cPar_00;
  undefined8 in_stack_ffffffffffffffa4;
  undefined8 local_34;
  undefined8 local_2c;
  undefined8 local_24;
  undefined4 local_1c;
  size_t dictSize_local;
  unsigned_long_long srcSize_local;
  
  auVar1 = cPar._8_20_;
  cParams._20_8_ = in_stack_ffffffffffffffa4;
  cParams.windowLog = auVar1._0_4_;
  cParams.chainLog = auVar1._4_4_;
  cParams.hashLog = auVar1._8_4_;
  cParams.searchLog = auVar1._12_4_;
  cParams.minMatch = auVar1._16_4_;
  ZSTD_clampCParams(cParams);
  cPar_00._8_8_ = local_2c;
  cPar_00._0_8_ = local_34;
  cPar_00._16_8_ = local_24;
  cPar_00.strategy = local_1c;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar_00,srcSize,dictSize);
  return __return_storage_ptr__;
}

Assistant:

ZSTD_compressionParameters
ZSTD_adjustCParams(ZSTD_compressionParameters cPar,
                   unsigned long long srcSize,
                   size_t dictSize)
{
    cPar = ZSTD_clampCParams(cPar);
    return ZSTD_adjustCParams_internal(cPar, srcSize, dictSize);
}